

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O1

void Dau_TruthEnum(int nVars)

{
  ulong *puVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int *__ptr;
  int *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  Vec_Int_t *p;
  int *piVar6;
  ulong uVar7;
  FILE *__s;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int level;
  size_t __nmemb;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  timespec ts;
  long local_138;
  timespec local_f8 [12];
  
  iVar3 = clock_gettime(3,local_f8);
  local_138 = -1;
  if (-1 < iVar3) {
    local_138 = local_f8[0].tv_nsec / 1000 + local_f8[0].tv_sec * 1000000;
  }
  uVar10 = 1 << ((byte)nVars & 0x1f);
  uVar4 = Extra_Factorial(nVars);
  __ptr = Extra_PermSchedule(nVars);
  __ptr_00 = Extra_GreyCodeSchedule(nVars);
  uVar14 = 1L << (~(byte)(-1L << ((byte)nVars & 0x3f)) & 0x3f);
  __ptr_01 = calloc((long)(1 << ((char)uVar10 - 7U & 0x1f)),8);
  __nmemb = (size_t)(1 << ((byte)(uVar10 - 2) & 0x1f));
  __ptr_02 = calloc(__nmemb,8);
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p->pArray = piVar6;
  if (6 < (uint)nVars) {
    __assert_fail("nBits >= 0 && nBits <= 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0xc2,"word Abc_Tt6Mask(int)");
  }
  if (__ptr_01 == (void *)0x0) {
    puts("Cannot alloc memory for marks.");
  }
  else {
    if (__ptr_02 == (void *)0x0) {
      puts("Cannot alloc memory for table.");
    }
    uVar11 = 0;
    do {
      iVar3 = (int)uVar11;
      if ((uVar11 & 0x3ffff) == 0) {
        printf("Finished %08x.  Classes = %6d.  ",uVar11 & 0xffffffff,(ulong)(uint)p->nSize);
        level = 3;
        iVar5 = clock_gettime(3,local_f8);
        if (iVar5 < 0) {
          lVar9 = -1;
        }
        else {
          lVar9 = local_f8[0].tv_nsec / 1000 + local_f8[0].tv_sec * 1000000;
        }
        Abc_Print(level,"%s =","Time");
        Abc_Print(level,"%9.2f sec\n",(double)(lVar9 - local_138) / 1000000.0);
        fflush(_stdout);
      }
      uVar7 = uVar11;
      if ((*(ulong *)((long)__ptr_01 + (long)(iVar3 >> 6) * 8) >> (uVar11 & 0x3f) & 1) == 0) {
        Vec_IntPush(p,iVar3);
        if (0 < (int)uVar4) {
          uVar12 = 0;
          do {
            uVar13 = 0;
            do {
              if (uVar7 < uVar14) {
                if (__ptr_02 != (void *)0x0) {
                  *(int *)((long)__ptr_02 + (long)(int)uVar7 * 4) = iVar3;
                }
                puVar1 = (ulong *)((long)__ptr_01 + (long)((int)uVar7 >> 6) * 8);
                *puVar1 = *puVar1 | 1L << ((byte)uVar7 & 0x3f);
              }
              uVar8 = ~uVar7 & 0xffffffffffffffffU >> (-(char)uVar10 & 0x3fU);
              if (uVar8 < uVar14) {
                if (__ptr_02 != (void *)0x0) {
                  *(int *)((long)__ptr_02 + (long)(int)uVar8 * 4) = iVar3;
                }
                puVar1 = (ulong *)((long)__ptr_01 + (long)((int)uVar8 >> 6) * 8);
                *puVar1 = *puVar1 | 1L << ((byte)uVar8 & 0x3f);
              }
              bVar2 = (byte)(1L << ((byte)__ptr_00[uVar13] & 0x3f));
              uVar7 = (s_Truths6[__ptr_00[uVar13]] & uVar7) >> (bVar2 & 0x3f) |
                      uVar7 << (bVar2 & 0x3f) & s_Truths6[__ptr_00[uVar13]];
              uVar13 = uVar13 + 1;
            } while (uVar10 != uVar13);
            iVar5 = __ptr[uVar12];
            bVar2 = (byte)(1L << ((byte)iVar5 & 0x3f));
            uVar7 = (uVar7 & s_PMasks[iVar5][2]) >> (bVar2 & 0x3f) |
                    (s_PMasks[iVar5][1] & uVar7) << (bVar2 & 0x3f) | s_PMasks[iVar5][0] & uVar7;
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar4);
        }
        if (uVar11 != uVar7) {
          __assert_fail("tTemp == tCur",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                        ,0x68,"void Dau_TruthEnum(int)");
        }
      }
      uVar11 = uVar7 + 1;
    } while (uVar11 < uVar14);
    printf("Computed %d NPN classes of %d variables.  ",(ulong)(uint)p->nSize,(ulong)(uint)nVars);
    iVar5 = 3;
    iVar3 = clock_gettime(3,local_f8);
    if (iVar3 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_f8[0].tv_nsec / 1000 + local_f8[0].tv_sec * 1000000;
    }
    Abc_Print(iVar5,"%s =","Time");
    Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar9 - local_138) / 1000000.0);
    fflush(_stdout);
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
      p->pArray = (int *)0x0;
    }
    free(p);
    free(__ptr_01);
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    if (__ptr_00 != (int *)0x0) {
      free(__ptr_00);
    }
    if (__ptr_02 != (void *)0x0) {
      sprintf((char *)local_f8,"tableW%d.data",(ulong)(uVar10 - 2));
      __s = fopen((char *)local_f8,"wb");
      fwrite(__ptr_02,8,__nmemb,__s);
      fclose(__s);
      free(__ptr_02);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////


////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Dau_TruthEnum(int nVars)
{
    int fUseTable = 1;
    abctime clk = Abc_Clock();
    int nSizeLog = (1<<nVars) -2;
    int nSizeW = 1 << nSizeLog;
    int nPerms  = Extra_Factorial( nVars );
    int nMints  = 1 << nVars;
    int * pPerm = Extra_PermSchedule( nVars );
    int * pComp = Extra_GreyCodeSchedule( nVars );
    word nFuncs = ((word)1 << (((word)1 << nVars)-1));
    word * pPres = ABC_CALLOC( word, 1 << ((1<<nVars)-7) );
    unsigned * pTable = fUseTable ? (unsigned *)ABC_CALLOC(word, nSizeW) : NULL;
    Vec_Int_t * vNpns = Vec_IntAlloc( 1000 );
    word tMask = Abc_Tt6Mask( 1 << nVars );
    word tTemp, tCur;
    int i, k;
    if ( pPres == NULL )
    {
        printf( "Cannot alloc memory for marks.\n" );
        return;
    }
    if ( pTable == NULL )
        printf( "Cannot alloc memory for table.\n" );
    for ( tCur = 0; tCur < nFuncs; tCur++ )
    {
        if ( (tCur & 0x3FFFF) == 0 )
        {
            printf( "Finished %08x.  Classes = %6d.  ", (int)tCur, Vec_IntSize(vNpns) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            fflush(stdout);
        }
        if ( Abc_TtGetBit(pPres, (int)tCur) )
            continue;
        //Extra_PrintBinary( stdout, (unsigned *)&tCur, 16 ); printf( " %04x\n", (int)tCur );
        //Dau_DsdPrintFromTruth( &tCur, 4 ); printf( "\n" );
        Vec_IntPush( vNpns, (int)tCur );
        tTemp = tCur;
        for ( i = 0; i < nPerms; i++ )
        {
            for ( k = 0; k < nMints; k++ )
            {
                if ( tCur < nFuncs )
                {
                    if ( pTable ) pTable[(int)tCur] = tTemp;
                    Abc_TtSetBit( pPres, (int)tCur );
                }
                if ( (tMask & ~tCur) < nFuncs )
                {
                    if ( pTable ) pTable[(int)(tMask & ~tCur)] = tTemp;
                    Abc_TtSetBit( pPres, (int)(tMask & ~tCur) );
                }
                tCur = Abc_Tt6Flip( tCur, pComp[k] );
            }
            tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[i] );
        }
        assert( tTemp == tCur );
    }
    printf( "Computed %d NPN classes of %d variables.  ", Vec_IntSize(vNpns), nVars );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    fflush(stdout);
    Vec_IntFree( vNpns );
    ABC_FREE( pPres );
    ABC_FREE( pPerm );
    ABC_FREE( pComp );
    // write into file
    if ( pTable )
    {
        FILE * pFile;
        int RetValue;
        char pFileName[200];
        sprintf( pFileName, "tableW%d.data", nSizeLog );
        pFile = fopen( pFileName, "wb" );
        RetValue = fwrite( pTable, 8, nSizeW, pFile );
        RetValue = 0;
        fclose( pFile );
        ABC_FREE( pTable );
    }
}